

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImGuiTabBar *tab_bar;
  int iVar1;
  ImGuiPopupData *pIVar2;
  undefined8 *puVar3;
  ImGuiTabBar *pIVar4;
  ImGuiWindow *pIVar5;
  undefined1 auVar6 [16];
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImGuiContext *g;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar11;
  undefined8 uVar12;
  int rect_n;
  long lVar13;
  ImDrawList *this;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  ImGuiTabItem *tab;
  float fVar17;
  ImRect IVar18;
  char *wrt_rects_names [7];
  char buf [256];
  ImVec2 local_180;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  char *local_168;
  char *pcStack_160;
  char *local_158;
  char *pcStack_150;
  char *local_148;
  ImRect local_138 [16];
  
  bVar9 = Begin("Dear ImGui Metrics",p_open,0);
  pIVar7 = GImGui;
  if (!bVar9) {
    End();
    return;
  }
  local_148 = "ContentsRegionRect";
  local_158 = "WorkRect";
  pcStack_150 = "Contents";
  local_168 = "InnerRect";
  pcStack_160 = "InnerClipRect";
  local_178._0_4_ = 0x194a31;
  local_178._4_4_ = 0;
  uStack_170 = 0x194a3b;
  uStack_16c = 0;
  if (GImGui != (ImGuiContext *)0x0) {
    Text("Dear ImGui %s","1.74 WIP");
    fVar17 = (pIVar7->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar17),0),
         (double)fVar17);
    iVar1 = (pIVar7->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar7->IO).MetricsRenderVertices,
         (long)iVar1,(ulong)(uint)(iVar1 / 3));
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar7->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar7->IO).MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)(pIVar7->IO).MetricsActiveAllocations);
    Separator();
    windows = &pIVar7->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
    bVar9 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar7->DrawDataBuilder).Layers[0].Size);
    if (bVar9) {
      if (0 < (pIVar7->DrawDataBuilder).Layers[0].Size) {
        lVar13 = 0;
        pcVar11 = extraout_RDX;
        do {
          ShowMetricsWindow::Funcs::NodeDrawList
                    ((ImGuiWindow *)0x0,(pIVar7->DrawDataBuilder).Layers[0].Data[lVar13],pcVar11);
          lVar13 = lVar13 + 1;
          pcVar11 = extraout_RDX_00;
        } while (lVar13 < (pIVar7->DrawDataBuilder).Layers[0].Size);
      }
      TreePop();
    }
    bVar9 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar7->OpenPopupStack).Size);
    if (bVar9) {
      if (0 < (pIVar7->OpenPopupStack).Size) {
        lVar16 = 8;
        lVar13 = 0;
        do {
          pIVar2 = (pIVar7->OpenPopupStack).Data;
          puVar3 = *(undefined8 **)((long)&pIVar2->PopupId + lVar16);
          pcVar10 = "";
          pcVar11 = "NULL";
          pcVar14 = "";
          if (puVar3 != (undefined8 *)0x0) {
            pcVar11 = (char *)*puVar3;
            pcVar10 = " ChildWindow";
            if ((*(uint *)((long)puVar3 + 0xc) >> 0x18 & 1) == 0) {
              pcVar10 = "";
            }
            pcVar14 = " ChildMenu";
            if ((*(uint *)((long)puVar3 + 0xc) >> 0x1c & 1) == 0) {
              pcVar14 = "";
            }
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar2 + lVar16 + -8),pcVar11,pcVar10,pcVar14);
          lVar13 = lVar13 + 1;
          lVar16 = lVar16 + 0x30;
        } while (lVar13 < (pIVar7->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar9 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar7->TabBars).Data.Size);
    if (bVar9) {
      if (0 < (pIVar7->TabBars).Data.Size) {
        lVar13 = 0;
        do {
          pIVar4 = (pIVar7->TabBars).Data.Data;
          tab_bar = pIVar4 + lVar13;
          pcVar11 = "";
          if (pIVar4[lVar13].PrevFrameVisible < GImGui->FrameCount + -2) {
            pcVar11 = " *Inactive*";
          }
          ImFormatString((char *)local_138,0x100,"TabBar (%d tabs)%s",
                         (ulong)(uint)pIVar4[lVar13].Tabs.Size,pcVar11);
          bVar9 = TreeNode(tab_bar,"%s",local_138);
          if (bVar9) {
            if (0 < (tab_bar->Tabs).Size) {
              lVar16 = 0;
              uVar15 = 0;
              do {
                tab = (ImGuiTabItem *)((long)&((tab_bar->Tabs).Data)->ID + lVar16);
                PushID(tab);
                bVar9 = SmallButton("<");
                if (bVar9) {
                  TabBarQueueChangeTabOrder(tab_bar,tab,-1);
                }
                pIVar5 = GImGui->CurrentWindow;
                pIVar5->WriteAccessed = true;
                if (pIVar5->SkipItems == false) {
                  fVar17 = (pIVar5->DC).CursorPosPrevLine.y;
                  (pIVar5->DC).CursorPos.x = (pIVar5->DC).CursorPosPrevLine.x + 2.0;
                  (pIVar5->DC).CursorPos.y = fVar17;
                  (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
                  (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
                }
                bVar9 = SmallButton(">");
                if (bVar9) {
                  TabBarQueueChangeTabOrder(tab_bar,tab,1);
                }
                pIVar8 = GImGui;
                pIVar5 = GImGui->CurrentWindow;
                pIVar5->WriteAccessed = true;
                if (pIVar5->SkipItems == false) {
                  (pIVar5->DC).CursorPos.x =
                       (pIVar8->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
                  (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
                  (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
                  (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
                }
                uVar12 = 0x2a;
                if (tab->ID != tab_bar->SelectedTabId) {
                  uVar12 = 0x20;
                }
                Text("%02d%c Tab 0x%08X",uVar15 & 0xffffffff,uVar12);
                PopID();
                uVar15 = uVar15 + 1;
                lVar16 = lVar16 + 0x20;
              } while ((long)uVar15 < (long)(tab_bar->Tabs).Size);
            }
            TreePop();
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pIVar7->TabBars).Data.Size);
      }
      TreePop();
    }
    bVar9 = TreeNode("Internal state");
    if (bVar9) {
      pcVar10 = "NULL";
      pcVar11 = "NULL";
      if (pIVar7->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar7->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar11);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar7->HoveredIdTimer,0),(ulong)pIVar7->HoveredId,
           (ulong)pIVar7->HoveredIdPreviousFrame,(ulong)pIVar7->HoveredIdAllowOverlap);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar7->ActiveIdTimer,0),(ulong)pIVar7->ActiveId,
           (ulong)pIVar7->ActiveIdPreviousFrame,(ulong)pIVar7->ActiveIdAllowOverlap,
           *(undefined8 *)(&DAT_001e8890 + (ulong)pIVar7->ActiveIdSource * 8));
      pcVar11 = "NULL";
      if (pIVar7->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar7->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar7->NavWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar11);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar7->NavId,(ulong)pIVar7->NavLayer);
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001e8890 + (ulong)pIVar7->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar7->IO).NavActive,
           (ulong)(pIVar7->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar7->NavActivateId,
           (ulong)pIVar7->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar7->NavDisableHighlight,
           (ulong)pIVar7->NavDisableMouseHover);
      if (pIVar7->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar10 = pIVar7->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar10);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar7->DragDropActive,(ulong)(pIVar7->DragDropPayload).SourceId,
           (pIVar7->DragDropPayload).DataType,(ulong)(uint)(pIVar7->DragDropPayload).DataSize);
      TreePop();
    }
    bVar9 = TreeNode("Tools");
    if (bVar9) {
      auVar6._8_8_ = 0;
      auVar6._0_4_ = local_138[0].Max.x;
      auVar6._4_4_ = local_138[0].Max.y;
      local_138[0] = (ImRect)(auVar6 << 0x40);
      bVar9 = Button("Item Picker..",&local_138[0].Min);
      if (bVar9) {
        GImGui->DebugItemPickerActive = true;
      }
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      pIVar8 = GImGui;
      pIVar5 = GImGui->CurrentWindow;
      pIVar5->WriteAccessed = true;
      if (pIVar5->SkipItems == false) {
        (pIVar5->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
        (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
        (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
        (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      }
      fVar17 = pIVar8->FontSize;
      *(byte *)&(pIVar8->NextItemData).Flags = (byte)(pIVar8->NextItemData).Flags | 1;
      (pIVar8->NextItemData).Width = fVar17 * 12.0;
      bVar9 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,
                    (char **)&local_178,7,-1);
      ShowMetricsWindow::show_windows_rects = (bool)(ShowMetricsWindow::show_windows_rects | bVar9);
      if ((ShowMetricsWindow::show_windows_rects != false) &&
         (pIVar7->NavWindow != (ImGuiWindow *)0x0)) {
        lVar13 = 0;
        BulletText("\'%s\':",pIVar7->NavWindow->Name);
        pIVar8 = GImGui;
        pIVar5 = GImGui->CurrentWindow;
        pIVar5->WriteAccessed = true;
        fVar17 = (pIVar8->Style).IndentSpacing + (pIVar5->DC).Indent.x;
        (pIVar5->DC).Indent.x = fVar17;
        (pIVar5->DC).CursorPos.x = fVar17 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
        do {
          IVar18 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar7->NavWindow,(int)lVar13);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar18.Min.x,0),
               (double)IVar18.Min.y,(double)IVar18.Max.x,(double)IVar18.Max.y,
               (double)(IVar18.Max.x - IVar18.Min.x),(double)(IVar18.Max.y - IVar18.Min.y),
               (&local_178)[lVar13]);
          pIVar8 = GImGui;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 7);
        pIVar5 = GImGui->CurrentWindow;
        pIVar5->WriteAccessed = true;
        fVar17 = (pIVar5->DC).Indent.x - (pIVar8->Style).IndentSpacing;
        (pIVar5->DC).Indent.x = fVar17;
        (pIVar5->DC).CursorPos.x = fVar17 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
      }
      Checkbox("Show clipping rectangle when hovering ImDrawCmd node",
               &ShowMetricsWindow::show_drawcmd_clip_rects);
      TreePop();
    }
    if (((ShowMetricsWindow::show_windows_rects != false) ||
        (ShowMetricsWindow::show_windows_begin_order == true)) && (0 < windows->Size)) {
      lVar13 = 0;
      do {
        pIVar5 = (pIVar7->Windows).Data[lVar13];
        if (pIVar5->WasActive == true) {
          this = &GImGui->ForegroundDrawList;
          if (ShowMetricsWindow::show_windows_rects == true) {
            local_138[0] = ShowMetricsWindow::Funcs::GetWindowRect
                                     (pIVar5,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect(this,&local_138[0].Min,&local_138[0].Max,0xff8000ff,0.0,0xf,1.0);
          }
          if ((ShowMetricsWindow::show_windows_begin_order == true) &&
             ((pIVar5->Flags & 0x1000000) == 0)) {
            ImFormatString((char *)local_138,0x20,"%d",
                           (ulong)(uint)(int)pIVar5->BeginOrderWithinContext);
            local_180.y = GImGui->FontSize + (pIVar5->Pos).y;
            local_180.x = GImGui->FontSize + (pIVar5->Pos).x;
            ImDrawList::AddRectFilled(this,&pIVar5->Pos,&local_180,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(this,&pIVar5->Pos,0xffffffff,(char *)local_138,(char *)0x0);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < windows->Size);
    }
    End();
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0xc23,"ImGuiIO &ImGui::GetIO()");
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // State
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Contents, WRT_ContentsRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Contents", "ContentsRegionRect" };
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_drawcmd_clip_rects = true;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList
    // - NodeColumns
    // - NodeWindow
    // - NodeWindows
    // - NodeTabBar
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Contents)             { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentsRegionRect)   { return window->ContentsRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y);
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.size_in_bytes());
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s", tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

#if 0
    if (ImGui::TreeNode("Docking"))
    {
        ImGui::TreePop();
    }
#endif

#if 0
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.Data.Size))
    {
        ImGui::TreePop();
    }
#endif

    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }

    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show clipping rectangle when hovering ImDrawCmd node", &show_drawcmd_clip_rects);
        ImGui::TreePop();
    }

    // Tool: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }
    ImGui::End();
}